

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

cpu_times * __thiscall lf::base::Timer::Elapsed(cpu_times *__return_storage_ptr__,Timer *this)

{
  long lVar1;
  rep rVar2;
  
  if (this->is_stopped_ == true) {
    (__return_storage_ptr__->system).__r = (this->times_).system.__r;
    rVar2 = (this->times_).user.__r;
    (__return_storage_ptr__->wall).__r = (this->times_).wall.__r;
    (__return_storage_ptr__->user).__r = rVar2;
  }
  else {
    anon_unknown.dwarf_754f7::get_cpu_times(__return_storage_ptr__);
    lVar1 = (this->times_).user.__r;
    (__return_storage_ptr__->wall).__r =
         (__return_storage_ptr__->wall).__r - (this->times_).wall.__r;
    (__return_storage_ptr__->user).__r = (__return_storage_ptr__->user).__r - lVar1;
    (__return_storage_ptr__->system).__r =
         (__return_storage_ptr__->system).__r - (this->times_).system.__r;
  }
  return __return_storage_ptr__;
}

Assistant:

Timer::cpu_times Timer::Elapsed() const noexcept {
  if (IsStopped()) {
    return times_;
  }

  cpu_times current;  // NOLINT
  get_cpu_times(&current);
  current.wall -= times_.wall;
  current.user -= times_.user;
  current.system -= times_.system;

  return current;
}